

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_generator.cc
# Opt level: O1

bool __thiscall re2::StringGenerator::IncrementDigits(StringGenerator *this)

{
  pointer piVar1;
  iterator __position;
  pointer pbVar2;
  pointer pbVar3;
  bool bVar4;
  uint in_EAX;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  undefined8 uStack_8;
  
  piVar1 = (this->digits_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->digits_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  uVar5 = (uint)((ulong)((long)__position._M_current - (long)piVar1) >> 2);
  bVar4 = (int)uVar5 < 1;
  if (0 < (int)uVar5) {
    pbVar2 = (this->alphabet_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = (this->alphabet_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (ulong)(uVar5 & 0x7fffffff);
    iVar7 = piVar1[uVar6 - 1] + 1;
    piVar1[uVar6 - 1] = iVar7;
    while ((int)((ulong)((long)pbVar2 - (long)pbVar3) >> 5) <= iVar7) {
      piVar1[uVar6 - 1] = 0;
      bVar4 = (long)uVar6 < 2;
      if ((long)uVar6 < 2) goto LAB_0011cf9b;
      iVar7 = piVar1[uVar6 - 2] + 1;
      piVar1[uVar6 - 2] = iVar7;
      uVar6 = uVar6 - 1;
    }
    if (!bVar4) {
      return true;
    }
  }
LAB_0011cf9b:
  if ((int)uVar5 < this->maxlen_) {
    uStack_8 = (ulong)in_EAX;
    if (__position._M_current ==
        (this->digits_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->digits_,__position,(int *)((long)&uStack_8 + 4));
    }
    else {
      *__position._M_current = 0;
      (this->digits_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
    }
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool StringGenerator::IncrementDigits() {
  // First try to increment the current number.
  for (int i = static_cast<int>(digits_.size()) - 1; i >= 0; i--) {
    if (++digits_[i] < static_cast<int>(alphabet_.size()))
      return true;
    digits_[i] = 0;
  }

  // If that failed, make a longer number.
  if (static_cast<int>(digits_.size()) < maxlen_) {
    digits_.push_back(0);
    return true;
  }

  return false;
}